

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O1

void Json::StreamWriterBuilder::setDefaults(Value *settings)

{
  Value *pVVar1;
  Value local_100;
  Value local_d8;
  Value local_b0;
  Value local_88;
  Value local_60;
  Value local_38;
  
  Value::Value(&local_38,"All");
  pVVar1 = Value::operator[](settings,"commentStyle");
  Value::operator=(pVVar1,&local_38);
  Value::~Value(&local_38);
  Value::Value(&local_60,"\t");
  pVVar1 = Value::operator[](settings,"indentation");
  Value::operator=(pVVar1,&local_60);
  Value::~Value(&local_60);
  Value::Value(&local_88,false);
  pVVar1 = Value::operator[](settings,"enableYAMLCompatibility");
  Value::operator=(pVVar1,&local_88);
  Value::~Value(&local_88);
  Value::Value(&local_b0,false);
  pVVar1 = Value::operator[](settings,"dropNullPlaceholders");
  Value::operator=(pVVar1,&local_b0);
  Value::~Value(&local_b0);
  Value::Value(&local_d8,false);
  pVVar1 = Value::operator[](settings,"useSpecialFloats");
  Value::operator=(pVVar1,&local_d8);
  Value::~Value(&local_d8);
  Value::Value(&local_100,0x11);
  pVVar1 = Value::operator[](settings,"precision");
  Value::operator=(pVVar1,&local_100);
  Value::~Value(&local_100);
  return;
}

Assistant:

void StreamWriterBuilder::setDefaults(Json::Value* settings)
{
  //! [StreamWriterBuilderDefaults]
  (*settings)["commentStyle"] = "All";
  (*settings)["indentation"] = "\t";
  (*settings)["enableYAMLCompatibility"] = false;
  (*settings)["dropNullPlaceholders"] = false;
  (*settings)["useSpecialFloats"] = false;
  (*settings)["precision"] = 17;
  //! [StreamWriterBuilderDefaults]
}